

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nametoaddr.c
# Opt level: O2

u_char * pcap_ether_aton(char *s)

{
  byte *pbVar1;
  int iVar2;
  int iVar3;
  byte *pbVar4;
  ushort **ppuVar5;
  byte bVar6;
  byte *pbVar7;
  
  pbVar4 = (byte *)malloc(6);
  pbVar7 = pbVar4;
  if (pbVar4 == (byte *)0x0) {
    return (u_char *)0x0;
  }
  do {
    bVar6 = *s;
    if ((bVar6 - 0x2d < 2) || (bVar6 == 0x3a)) {
      bVar6 = ((byte *)s)[1];
      s = (char *)((byte *)s + 1);
    }
    else if (bVar6 == 0) {
      return pbVar4;
    }
    iVar2 = xdtoi((int)(char)bVar6);
    bVar6 = (byte)iVar2;
    ppuVar5 = __ctype_b_loc();
    pbVar1 = (byte *)s + 1;
    if ((*(byte *)((long)*ppuVar5 + (ulong)*pbVar1 * 2 + 1) & 0x10) == 0) {
      s = (char *)((byte *)s + 1);
    }
    else {
      s = (char *)((byte *)s + 2);
      iVar3 = xdtoi((int)(char)*pbVar1);
      bVar6 = (byte)(iVar2 << 4) | (byte)iVar3;
    }
    *pbVar7 = bVar6;
    pbVar7 = pbVar7 + 1;
  } while( true );
}

Assistant:

u_char *
pcap_ether_aton(const char *s)
{
	register u_char *ep, *e;
	register u_int d;

	e = ep = (u_char *)malloc(6);
	if (e == NULL)
		return (NULL);

	while (*s) {
		if (*s == ':' || *s == '.' || *s == '-')
			s += 1;
		d = xdtoi(*s++);
		if (isxdigit((unsigned char)*s)) {
			d <<= 4;
			d |= xdtoi(*s++);
		}
		*ep++ = d;
	}

	return (e);
}